

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result wabt::TypeChecker::CheckType(Type actual,Type expected)

{
  bool bVar1;
  Enum EVar2;
  Type local_14;
  Type local_10;
  Type expected_local;
  Type actual_local;
  
  local_14.enum_ = expected.enum_;
  local_10.enum_ = actual.enum_;
  EVar2 = Type::operator_cast_to_Enum(&local_14);
  if ((EVar2 != Any) && (EVar2 = Type::operator_cast_to_Enum(&local_10), EVar2 != Any)) {
    bVar1 = IsSubtype(local_10,local_14);
    if (!bVar1) {
      Result::Result((Result *)&expected_local,Error);
      return (Result)expected_local.enum_;
    }
    Result::Result((Result *)&expected_local,Ok);
    return (Result)expected_local.enum_;
  }
  Result::Result((Result *)&expected_local,Ok);
  return (Result)expected_local.enum_;
}

Assistant:

Result TypeChecker::CheckType(Type actual, Type expected) {
  if (expected == Type::Any || actual == Type::Any) {
    return Result::Ok;
  }

  if (!IsSubtype(actual, expected)) {
    return Result::Error;
  }

  return Result::Ok;
}